

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O1

int testInvalidModelUnsupportedLayersForBP(void)

{
  RepeatedField<long> *this;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  pointer pcVar1;
  int iVar2;
  ConvolutionLayerParams *pCVar3;
  long lVar4;
  long lVar5;
  Rep *pRVar6;
  bool bVar7;
  ModelDescription *pMVar8;
  Type *pTVar9;
  FeatureType *pFVar10;
  ArrayFeatureType *pAVar11;
  TypeUnion TVar12;
  Type *pTVar13;
  InnerProductLayerParams *this_01;
  WeightParams *pWVar14;
  UnaryFunctionLayerParams *this_02;
  PoolingLayerParams *pPVar15;
  ValidPadding *this_03;
  NetworkUpdateParameters *this_04;
  Type *this_05;
  CategoricalCrossEntropyLossLayer *pCVar16;
  ostream *poVar17;
  int iVar18;
  Result res;
  Model m;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58);
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
    local_58.description_ = pMVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar9->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (pTVar9->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  pFVar10 = pTVar9->type_;
  if (pFVar10->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar10->Type_).multiarraytype_ = pAVar11;
  }
  if (pTVar9->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  pFVar10 = pTVar9->type_;
  if (pFVar10->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar10->Type_).multiarraytype_ = pAVar11;
  }
  pAVar11 = (pFVar10->Type_).multiarraytype_;
  pAVar11->datatype_ = 0x10020;
  this = &pAVar11->shape_;
  iVar2 = (pAVar11->shape_).total_size_;
  if ((pAVar11->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar2 + 1);
  }
  iVar2 = (pAVar11->shape_).current_size_;
  iVar18 = iVar2 + 1;
  (pAVar11->shape_).current_size_ = iVar18;
  ((pAVar11->shape_).rep_)->elements[iVar2] = 1;
  iVar2 = (pAVar11->shape_).total_size_;
  if (iVar18 == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar2 + 1);
  }
  iVar2 = (pAVar11->shape_).current_size_;
  iVar18 = iVar2 + 1;
  (pAVar11->shape_).current_size_ = iVar18;
  ((pAVar11->shape_).rep_)->elements[iVar2] = 1;
  iVar2 = (pAVar11->shape_).total_size_;
  if (iVar18 == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar2 + 1);
  }
  iVar2 = (pAVar11->shape_).current_size_;
  (pAVar11->shape_).current_size_ = iVar2 + 1;
  ((pAVar11->shape_).rep_)->elements[iVar2] = 1;
  if (local_58.description_ == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar8);
    local_58.description_ = pMVar8;
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_58.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar9->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (pTVar9->type_ == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar9->type_ = pFVar10;
  }
  pFVar10 = pTVar9->type_;
  if (pFVar10->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    pAVar11 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar11);
    (pFVar10->Type_).multiarraytype_ = pAVar11;
  }
  ((pFVar10->Type_).multiarraytype_)->datatype_ = 0x10020;
  local_58.isupdatable_ = true;
  local_58.specificationversion_ = 4;
  if (local_58._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_58);
    local_58._oneof_case_[0] = 500;
    TVar12.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar12.neuralnetwork_);
    local_58.Type_.pipelineclassifier_ = TVar12.pipelineclassifier_;
  }
  TVar12 = local_58.Type_;
  this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_58.Type_.pipeline_)->models_;
  pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_00,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"inner_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar13->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar13,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar13,"ip");
  pTVar13->isupdatable_ = true;
  if (pTVar13->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar13);
    pTVar13->_oneof_case_[0] = 0x8c;
    this_01 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_01);
    (pTVar13->layer_).innerproduct_ = this_01;
  }
  pCVar3 = (pTVar13->layer_).convolution_;
  *(undefined8 *)&pCVar3->_kernelsize_cached_byte_size_ = 1;
  (pCVar3->stride_).current_size_ = 1;
  (pCVar3->stride_).total_size_ = 0;
  lVar4._0_4_ = (pCVar3->kernelsize_).current_size_;
  lVar4._4_4_ = (pCVar3->kernelsize_).total_size_;
  if (lVar4 == 0) {
    pWVar14 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar14);
    *(WeightParams **)&pCVar3->kernelsize_ = pWVar14;
  }
  lVar4 = *(long *)&pCVar3->kernelsize_;
  if (*(int *)(lVar4 + 0x10) == *(int *)(lVar4 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve
              ((RepeatedField<float> *)(lVar4 + 0x10),*(int *)(lVar4 + 0x14) + 1);
  }
  iVar2 = *(int *)(lVar4 + 0x10);
  *(int *)(lVar4 + 0x10) = iVar2 + 1;
  *(undefined4 *)(*(long *)(lVar4 + 0x18) + 8 + (long)iVar2 * 4) = 0x3f800000;
  lVar5._0_4_ = (pCVar3->kernelsize_).current_size_;
  lVar5._4_4_ = (pCVar3->kernelsize_).total_size_;
  if (lVar5 == 0) {
    pWVar14 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar14);
    *(WeightParams **)&pCVar3->kernelsize_ = pWVar14;
  }
  *(undefined1 *)(*(long *)&pCVar3->kernelsize_ + 0x48) = 1;
  *(undefined1 *)&(pCVar3->stride_).rep_ = 1;
  if ((pCVar3->kernelsize_).rep_ == (Rep *)0x0) {
    pWVar14 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar14);
    (pCVar3->kernelsize_).rep_ = (Rep *)pWVar14;
  }
  pRVar6 = (pCVar3->kernelsize_).rep_;
  iVar2 = *(int *)((long)&pRVar6[1].arena + 4);
  if (*(int *)&pRVar6[1].arena == iVar2) {
    google::protobuf::RepeatedField<float>::Reserve((RepeatedField<float> *)(pRVar6 + 1),iVar2 + 1);
  }
  iVar2 = *(int *)&pRVar6[1].arena;
  *(int *)&pRVar6[1].arena = iVar2 + 1;
  *(undefined4 *)(pRVar6[1].elements[0] + 8 + (long)iVar2 * 4) = 0x3f800000;
  if ((pCVar3->kernelsize_).rep_ == (Rep *)0x0) {
    pWVar14 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar14);
    (pCVar3->kernelsize_).rep_ = (Rep *)pWVar14;
  }
  *(undefined1 *)(pCVar3->kernelsize_).rep_[4].elements = 1;
  pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_00,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"abs_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar13->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar13,"ip");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar13,"abs_out");
  if (pTVar13->_oneof_case_[0] != 0xdc) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar13);
    pTVar13->_oneof_case_[0] = 0xdc;
    this_02 = (UnaryFunctionLayerParams *)operator_new(0x28);
    CoreML::Specification::UnaryFunctionLayerParams::UnaryFunctionLayerParams(this_02);
    (pTVar13->layer_).unary_ = this_02;
  }
  (((pTVar13->layer_).convolution_)->kernelsize_).current_size_ = 6;
  pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this_00,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"pooling_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar13->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar13,"abs_out");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar13,"B");
  if (pTVar13->_oneof_case_[0] != 0x78) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar13);
    pTVar13->_oneof_case_[0] = 0x78;
    pPVar15 = (PoolingLayerParams *)operator_new(0x58);
    CoreML::Specification::PoolingLayerParams::PoolingLayerParams(pPVar15);
    (pTVar13->layer_).pooling_ = pPVar15;
  }
  pPVar15 = (pTVar13->layer_).pooling_;
  pPVar15->type_ = 1;
  pPVar15->globalpooling_ = true;
  if (pPVar15->_oneof_case_[0] != 0x1e) {
    CoreML::Specification::PoolingLayerParams::clear_PoolingPaddingType(pPVar15);
    pPVar15->_oneof_case_[0] = 0x1e;
    this_03 = (ValidPadding *)operator_new(0x20);
    CoreML::Specification::ValidPadding::ValidPadding(this_03);
    (pPVar15->PoolingPaddingType_).valid_ = this_03;
  }
  if ((TVar12.neuralnetworkregressor_)->updateparams_ == (NetworkUpdateParameters *)0x0) {
    this_04 = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this_04);
    (TVar12.neuralnetworkregressor_)->updateparams_ = this_04;
  }
  this_05 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&((TVar12.neuralnetworkregressor_)->updateparams_->losslayers_).
                        super_RepeatedPtrFieldBase,(Type *)0x0);
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"loss_layer","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_05->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if (this_05->_oneof_case_[0] != 10) {
    CoreML::Specification::LossLayer::clear_LossLayerType(this_05);
    this_05->_oneof_case_[0] = 10;
    pCVar16 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
    CoreML::Specification::CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer
              (pCVar16);
    (this_05->LossLayerType_).categoricalcrossentropylosslayer_ = pCVar16;
  }
  pCVar16 = (this_05->LossLayerType_).categoricalcrossentropylosslayer_;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pCVar16->input_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"label_target","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pCVar16->target_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  CoreML::Model::validate((Result *)local_80,&local_58);
  bVar7 = CoreML::Result::good((Result *)local_80);
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x168);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._8_8_ != &local_68) {
    operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return (uint)bVar7;
}

Assistant:

int testInvalidModelUnsupportedLayersForBP() {

    /* checks if there are layers between updatable-marked layers and loss function that do not support back-propagation
     input ---> inner_product (U) ----> ABS (not supported for BP) ---> pooling --> output
     */


    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    shape->add_shape(1);
    shape->add_shape(1);
    shape->add_shape(1);

    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    auto *type_out = out->mutable_type()->mutable_multiarraytype();
    type_out->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    m.set_isupdatable(true);
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    auto *nn = m.mutable_neuralnetwork();
    auto *l1 = nn->add_layers();
    l1->set_name("inner_layer");
    l1->add_input("A");
    l1->add_output("ip");
    l1->set_isupdatable(true);
    Specification::InnerProductLayerParams *innerProductParams = l1->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);
    innerProductParams->mutable_weights()->add_floatvalue(1.0);
    innerProductParams->mutable_weights()->set_isupdatable(true);
    innerProductParams->set_hasbias(true);
    innerProductParams->mutable_bias()->add_floatvalue(1.0);
    innerProductParams->mutable_bias()->set_isupdatable(true);

    auto *l2 = nn->add_layers();
    l2->set_name("abs_layer");
    l2->add_input("ip");
    l2->add_output("abs_out");
    auto *elem = l2->mutable_unary();
    elem->set_type(Specification::UnaryFunctionLayerParams::ABS);

    auto *l3 = nn->add_layers();
    l3->set_name("pooling_layer");
    l3->add_input("abs_out");
    l3->add_output("B");
    auto *params = l3->mutable_pooling();
    params->set_type(::Specification::PoolingLayerParams::AVERAGE);
    params->set_globalpooling(true);
    params->mutable_valid();

    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("loss_layer");

    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input("B");
    ceLossLayer->set_target("label_target");

    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}